

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::
cni_holder<void_(cs_impl::fiber::Channel<cs_impl::any>::*)(const_cs_impl::any_&),_void_(*)(cs_impl::fiber::Channel<cs_impl::any>_&,_const_cs_impl::any_&)>
::cni_holder(cni_holder<void_(cs_impl::fiber::Channel<cs_impl::any>::*)(const_cs_impl::any_&),_void_(*)(cs_impl::fiber::Channel<cs_impl::any>_&,_const_cs_impl::any_&)>
             *this,offset_in_Channel<cs_impl::any>_to_subr *func)

{
  function<void_(cs_impl::fiber::Channel<cs_impl::any>_&,_const_cs_impl::any_&)> *in_RDI;
  cni_helper<void_(*)(cs_impl::fiber::Channel<cs_impl::any>_&,_const_cs_impl::any_&),_void_(*)(cs_impl::fiber::Channel<cs_impl::any>_&,_const_cs_impl::any_&)>
  *this_00;
  offset_in_Channel<cs_impl::any>_to_subr *in_stack_ffffffffffffffc8;
  function<void_(cs_impl::fiber::Channel<cs_impl::any>_&,_const_cs_impl::any_&)>
  *in_stack_ffffffffffffffd0;
  
  cni_holder_base::cni_holder_base((cni_holder_base *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__cni_holder_003bb760;
  this_00 = (cni_helper<void_(*)(cs_impl::fiber::Channel<cs_impl::any>_&,_const_cs_impl::any_&),_void_(*)(cs_impl::fiber::Channel<cs_impl::any>_&,_const_cs_impl::any_&)>
             *)((long)&(in_RDI->super__Function_base)._M_functor + 8);
  std::function<void(cs_impl::fiber::Channel<cs_impl::any>&,cs_impl::any_const&)>::
  function<void(cs_impl::fiber::Channel<cs_impl::any>::*const&)(cs_impl::any_const&),void>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  cni_helper<void_(*)(cs_impl::fiber::Channel<cs_impl::any>_&,_const_cs_impl::any_&),_void_(*)(cs_impl::fiber::Channel<cs_impl::any>_&,_const_cs_impl::any_&)>
  ::cni_helper(this_00,in_RDI);
  std::function<void_(cs_impl::fiber::Channel<cs_impl::any>_&,_const_cs_impl::any_&)>::~function
            ((function<void_(cs_impl::fiber::Channel<cs_impl::any>_&,_const_cs_impl::any_&)> *)
             0x2a6956);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}